

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VkResult fill_out_count_pointer_pair<VkLayerProperties>
                   (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *data_vec,
                   uint32_t *pCount,VkLayerProperties *pData)

{
  VkResult VVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (pCount != (uint32_t *)0x0) {
    uVar3 = ((long)(data_vec->
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(data_vec->
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3) * 0xfc0fc0fc0fc0fc1;
    if (pData == (VkLayerProperties *)0x0) {
      VVar1 = VK_SUCCESS;
      uVar4 = uVar3 & 0xffffffff;
    }
    else {
      uVar2 = (ulong)*pCount;
      uVar4 = uVar3 & 0xffffffff;
      if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
        uVar4 = (ulong)*pCount;
      }
      if ((int)uVar4 != 0) {
        lVar5 = 0;
        do {
          memcpy(pData->layerName + lVar5,
                 ((data_vec->
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>)._M_impl
                  .super__Vector_impl_data._M_start)->layerName + lVar5,0x208);
          lVar5 = lVar5 + 0x208;
        } while (uVar4 * 0x208 != lVar5);
        uVar2 = (ulong)*pCount;
        uVar3 = ((long)(data_vec->
                       super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(data_vec->
                       super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3) * 0xfc0fc0fc0fc0fc1;
      }
      VVar1 = (uint)(uVar2 < uVar3) * 5;
    }
    *pCount = (uint32_t)uVar4;
    return VVar1;
  }
  return VK_ERROR_OUT_OF_HOST_MEMORY;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}